

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void ym2203_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  int iVar1;
  FM_OPN *OPN_00;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  DEV_SMPL lt;
  FM_CH *cch [3];
  DEV_SMPL *local_48;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  UINT32 i;
  FM_OPN *OPN;
  YM2203 *F2203;
  DEV_SMPL **buffer_local;
  UINT32 length_local;
  void *chip_local;
  
  OPN_00 = (FM_OPN *)((long)chip + 0x108);
  if (buffer == (DEV_SMPL **)0x0) {
    local_48 = (DEV_SMPL *)0x0;
    bufR = (DEV_SMPL *)0x0;
  }
  else {
    bufR = *buffer;
    local_48 = buffer[1];
  }
  CH = (FM_CH *)((long)chip + 0x4678);
  CH_00 = (FM_CH *)((long)chip + 0x4810);
  CH_01 = (FM_CH *)((long)chip + 0x49a8);
  refresh_fc_eg_chan(OPN_00,CH);
  refresh_fc_eg_chan(OPN_00,CH_00);
  if ((*(uint *)((long)chip + 0x130) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN_00,CH_01);
  }
  else if (*(int *)((long)chip + 0x49d0) == -1) {
    refresh_fc_eg_slot(OPN_00,(FM_SLOT *)CH_01,*(int *)((long)chip + 0x584),
                       (uint)*(byte *)((long)chip + 0x58e));
    refresh_fc_eg_slot(OPN_00,(FM_SLOT *)((long)chip + 0x4a48),*(int *)((long)chip + 0x588),
                       (uint)*(byte *)((long)chip + 0x58f));
    refresh_fc_eg_slot(OPN_00,(FM_SLOT *)((long)chip + 0x49f8),*(int *)((long)chip + 0x580),
                       (uint)*(byte *)((long)chip + 0x58d));
    refresh_fc_eg_slot(OPN_00,(FM_SLOT *)((long)chip + 0x4a98),*(int *)((long)chip + 0x4b2c),
                       (uint)*(byte *)((long)chip + 0x4b30));
  }
  if (length == 0) {
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
  }
  *(undefined4 *)((long)chip + 0x45fc) = 0;
  *(undefined4 *)((long)chip + 0x4600) = 0;
  for (bufL._4_4_ = 0; bufL._4_4_ < length; bufL._4_4_ = bufL._4_4_ + 1) {
    *(undefined4 *)((long)chip + 0x4614) = 0;
    *(undefined4 *)((long)chip + 0x4618) = 0;
    *(undefined4 *)((long)chip + 0x461c) = 0;
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    chan_calc(OPN_00,CH,0);
    chan_calc(OPN_00,CH_00,1);
    chan_calc(OPN_00,CH_01,2);
    *(int *)((long)chip + 0x5dc) = *(int *)((long)chip + 0x5e0) + *(int *)((long)chip + 0x5dc);
    while (*(uint *)((long)chip + 0x5e4) <= *(uint *)((long)chip + 0x5dc)) {
      *(int *)((long)chip + 0x5dc) = *(int *)((long)chip + 0x5dc) - *(int *)((long)chip + 0x5e4);
      *(int *)((long)chip + 0x5d8) = *(int *)((long)chip + 0x5d8) + 1;
      advance_eg_channel(OPN_00,(FM_SLOT *)CH);
      advance_eg_channel(OPN_00,(FM_SLOT *)CH_00);
      advance_eg_channel(OPN_00,(FM_SLOT *)CH_01);
    }
    iVar1 = *(int *)((long)chip + 0x4614) + *(int *)((long)chip + 0x4618) +
            *(int *)((long)chip + 0x461c);
    bufR[bufL._4_4_] = iVar1;
    local_48[bufL._4_4_] = iVar1;
    *(char *)((long)chip + 0x59c) = *(char *)((long)chip + 0x59c) << 1;
    if ((((*(int *)((long)chip + 0x13c) != 0) && (*(long *)((long)chip + 0x548) == 0)) &&
        (iVar1 = *(int *)((long)chip + 0x13c) - (int)(*(double *)((long)chip + 0x120) * 4096.0),
        *(int *)((long)chip + 0x13c) = iVar1, iVar1 < 1)) &&
       (TimerAOver((FM_ST *)((long)chip + 0x110)), (*(uint *)((long)chip + 0x130) & 0xc0) == 0x80))
    {
      CSMKeyControl(OPN_00,CH_01);
    }
    if ((*(byte *)((long)chip + 0x59c) & 2) != 0) {
      FM_KEYOFF_CSM(CH_01,0);
      FM_KEYOFF_CSM(CH_01,2);
      FM_KEYOFF_CSM(CH_01,1);
      FM_KEYOFF_CSM(CH_01,3);
      *(undefined1 *)((long)chip + 0x59c) = 0;
    }
  }
  if (((*(int *)((long)chip + 0x144) != 0) && (*(long *)((long)chip + 0x548) == 0)) &&
     (iVar1 = *(int *)((long)chip + 0x144) -
              (int)(*(double *)((long)chip + 0x120) * 4096.0 * (double)length),
     *(int *)((long)chip + 0x144) = iVar1, iVar1 < 1)) {
    TimerBOver((FM_ST *)((long)chip + 0x110));
  }
  return;
}

Assistant:

void ym2203_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2203 *F2203 = (YM2203 *)chip;
	FM_OPN *OPN =   &F2203->OPN;
	UINT32 i;
	DEV_SMPL  *bufL,*bufR;
	FM_CH   *cch[3];

	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		bufL = bufR = NULL;
	}
	cch[0]   = &F2203->CH[0];
	cch[1]   = &F2203->CH[1];
	cch[2]   = &F2203->CH[2];


	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}
	else
		refresh_fc_eg_chan( OPN, cch[2] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
	}


	/* YM2203 doesn't have LFO so we must keep these globals at 0 level */
	OPN->LFO_AM = 0;
	OPN->LFO_PM = 0;

	/* buffering */
	for (i=0; i < length ; i++)
	{
		/* clear outputs */
		OPN->out_fm[0] = 0;
		OPN->out_fm[1] = 0;
		OPN->out_fm[2] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);

		/* calculate FM */
		chan_calc(OPN, cch[0], 0 );
		chan_calc(OPN, cch[1], 1 );
		chan_calc(OPN, cch[2], 2 );

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
		}

		/* buffering */
		{
			DEV_SMPL lt;

			lt = OPN->out_fm[0] + OPN->out_fm[1] + OPN->out_fm[2];

			/* buffering */
			bufL[i] = lt;
			bufR[i] = lt;
		}

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		INTERNAL_TIMER_A( &OPN->ST , cch[2] )

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}